

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int doDeregisterArchiver(size_t idx)

{
  PHYSFS_ArchiveInfo *pPVar1;
  PHYSFS_Archiver *pPVar2;
  DirHandle *i;
  __PHYSFS_DIRHANDLE__ *p_Var3;
  __PHYSFS_DIRHANDLE__ *p_Var4;
  size_t __n;
  
  pPVar1 = archiveInfo[idx];
  pPVar2 = archivers[idx];
  for (p_Var3 = searchPath; p_Var4 = writeDir, p_Var3 != (DirHandle *)0x0; p_Var3 = p_Var3->next) {
    if (p_Var3->funcs == pPVar2) goto LAB_00107383;
  }
  while( true ) {
    if (p_Var4 == (DirHandle *)0x0) {
      __n = (numArchivers - idx) * 8;
      (*__PHYSFS_AllocatorHooks.Free)(pPVar1->extension);
      (*__PHYSFS_AllocatorHooks.Free)(pPVar1->description);
      (*__PHYSFS_AllocatorHooks.Free)(pPVar1->author);
      (*__PHYSFS_AllocatorHooks.Free)(pPVar1->url);
      (*__PHYSFS_AllocatorHooks.Free)(pPVar2);
      memmove(archiveInfo + idx,archiveInfo + idx + 1,__n);
      memmove(archivers + idx,archivers + idx + 1,__n);
      if (numArchivers != 0) {
        numArchivers = numArchivers - 1;
        return 1;
      }
      __assert_fail("numArchivers > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                    ,0x537,"int doDeregisterArchiver(const size_t)");
    }
    if (p_Var4->funcs == pPVar2) break;
    p_Var4 = p_Var4->next;
  }
LAB_00107383:
  PHYSFS_setErrorCode(PHYSFS_ERR_FILES_STILL_OPEN);
  return 0;
}

Assistant:

static int doDeregisterArchiver(const size_t idx)
{
    const size_t len = (numArchivers - idx) * sizeof (void *);
    PHYSFS_ArchiveInfo *info = archiveInfo[idx];
    PHYSFS_Archiver *arc = archivers[idx];

    /* make sure nothing is still using this archiver */
    if (archiverInUse(arc, searchPath) || archiverInUse(arc, writeDir))
        BAIL(PHYSFS_ERR_FILES_STILL_OPEN, 0);

    allocator.Free((void *) info->extension);
    allocator.Free((void *) info->description);
    allocator.Free((void *) info->author);
    allocator.Free((void *) info->url);
    allocator.Free((void *) arc);

    memmove(&archiveInfo[idx], &archiveInfo[idx+1], len);
    memmove(&archivers[idx], &archivers[idx+1], len);

    assert(numArchivers > 0);
    numArchivers--;

    return 1;
}